

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Stress::LongShaderCompileStressCase::verify
          (LongShaderCompileStressCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined4 extraout_var;
  char *description;
  undefined1 local_1a8 [384];
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  dVar3 = this->m_flags;
  iVar5 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  iVar4 = iVar5;
  if (((dVar3 & 1) != 0) && (ctx[0xc0] == (EVP_PKEY_CTX)0x0)) {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Fail, expected program to compile and link successfully.",0x38);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Linking failed");
    iVar4 = extraout_EAX;
  }
  if ((iVar5 == 0) || (ctx[0xc0] == (EVP_PKEY_CTX)0x0)) {
    if (iVar5 == 0) {
      return iVar4;
    }
    if (iVar5 == 0x505) {
      return iVar4;
    }
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Fail, expected GL_NO_ERROR or GL_OUT_OF_MEMORY, received ",0x39);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    description = "Unexpected GL error";
  }
  else {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Fail, program status OK but a GL error was received (",0x35);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    description = "Conflicting status";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             description);
  return extraout_EAX_00;
}

Assistant:

void LongShaderCompileStressCase::verify (const glu::ShaderProgram& program)
{
	tcu::TestLog&			log			= m_testCtx.getLog();
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const bool				isStrict	= (m_flags & CASE_REQUIRE_LINK_STATUS_OK) != 0;
	const glw::GLenum		errorCode	= gl.getError();

	if (isStrict && !program.isOk())
	{
		log << TestLog::Message << "Fail, expected program to compile and link successfully." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Linking failed");
	}

	if (program.isOk() && (errorCode != GL_NO_ERROR))
	{
		log << TestLog::Message << "Fail, program status OK but a GL error was received (" << errorCode << ")." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Conflicting status");
	}
	else if ((errorCode != GL_NO_ERROR) && (errorCode != GL_OUT_OF_MEMORY))
	{
		log << TestLog::Message << "Fail, expected GL_NO_ERROR or GL_OUT_OF_MEMORY, received " << errorCode << "." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected GL error");
	}
}